

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boostdep.cpp
# Opt level: O3

int __thiscall teebuf::overflow(teebuf *this,int c)

{
  streambuf *psVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  
  psVar1 = this->sb1_;
  if (*(undefined1 **)(psVar1 + 0x28) < *(undefined1 **)(psVar1 + 0x30)) {
    **(undefined1 **)(psVar1 + 0x28) = (char)c;
    *(long *)(psVar1 + 0x28) = *(long *)(psVar1 + 0x28) + 1;
    bVar3 = false;
  }
  else {
    iVar2 = (**(code **)(*(long *)psVar1 + 0x68))(psVar1,c & 0xff);
    bVar3 = iVar2 == -1;
  }
  psVar1 = this->sb2_;
  if (*(undefined1 **)(psVar1 + 0x28) < *(undefined1 **)(psVar1 + 0x30)) {
    **(undefined1 **)(psVar1 + 0x28) = (char)c;
    *(long *)(psVar1 + 0x28) = *(long *)(psVar1 + 0x28) + 1;
    bVar4 = false;
  }
  else {
    iVar2 = (**(code **)(*(long *)psVar1 + 0x68))(psVar1,c & 0xff);
    bVar4 = iVar2 == -1;
  }
  if (bVar4) {
    c = -1;
  }
  if (bVar3) {
    c = -1;
  }
  return c;
}

Assistant:

virtual int overflow( int c )
    {
        int r1 = sb1_->sputc( c );
        int r2 = sb2_->sputc( c );

        return r1 == EOF || r2 == EOF? EOF : c;
    }